

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_3;
  SolveBeforeConstraintSyntax *pSVar1;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SolveBeforeConstraintSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,args_1,&local_50,args_3,&local_60);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SolveBeforeConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SolveBeforeConstraintSyntax>(
        node.solve.deepClone(alloc),
        *deepClone(node.beforeExpr, alloc),
        node.before.deepClone(alloc),
        *deepClone(node.afterExpr, alloc),
        node.semi.deepClone(alloc)
    );
}